

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

void __thiscall
spvtools::opt::DebugScope::ToBinary
          (DebugScope *this,uint32_t type_id,uint32_t result_id,uint32_t ext_set,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *binary)

{
  iterator iVar1;
  uint *puVar2;
  uint uVar3;
  bool bVar4;
  uint local_38;
  uint local_34;
  
  bVar4 = this->lexical_scope_ == 0;
  uVar3 = 0x5000c;
  if (!bVar4) {
    uVar3 = (uint)(this->inlined_at_ != 0) << 0x10 | 0x6000c;
  }
  puVar2 = (uint *)operator_new(0x14);
  *puVar2 = uVar3;
  puVar2[1] = type_id;
  puVar2[2] = result_id;
  puVar2[3] = ext_set;
  puVar2[4] = bVar4 + 0x17;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)binary,
             (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish,puVar2,puVar2 + 5);
  uVar3 = this->lexical_scope_;
  if (uVar3 != 0) {
    iVar1._M_current =
         (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_34 = uVar3;
    if (iVar1._M_current ==
        (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (binary,iVar1,&local_34);
    }
    else {
      *iVar1._M_current = uVar3;
      (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    uVar3 = this->inlined_at_;
    if (uVar3 != 0) {
      iVar1._M_current =
           (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      local_38 = uVar3;
      if (iVar1._M_current ==
          (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (binary,iVar1,&local_38);
      }
      else {
        *iVar1._M_current = uVar3;
        (binary->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    }
  }
  operator_delete(puVar2,0x14);
  return;
}

Assistant:

void DebugScope::ToBinary(uint32_t type_id, uint32_t result_id,
                          uint32_t ext_set,
                          std::vector<uint32_t>* binary) const {
  uint32_t num_words = kDebugScopeNumWords;
  CommonDebugInfoInstructions dbg_opcode = CommonDebugInfoDebugScope;
  if (GetLexicalScope() == kNoDebugScope) {
    num_words = kDebugNoScopeNumWords;
    dbg_opcode = CommonDebugInfoDebugNoScope;
  } else if (GetInlinedAt() == kNoInlinedAt) {
    num_words = kDebugScopeNumWordsWithoutInlinedAt;
  }
  std::vector<uint32_t> operands = {
      (num_words << 16) | static_cast<uint16_t>(spv::Op::OpExtInst),
      type_id,
      result_id,
      ext_set,
      static_cast<uint32_t>(dbg_opcode),
  };
  binary->insert(binary->end(), operands.begin(), operands.end());
  if (GetLexicalScope() != kNoDebugScope) {
    binary->push_back(GetLexicalScope());
    if (GetInlinedAt() != kNoInlinedAt) binary->push_back(GetInlinedAt());
  }
}